

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O3

void do_cmd_read_scroll(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *obj;
  object *local_18;
  
  _Var1 = player_get_resume_normal_shape(player,cmd);
  if (_Var1) {
    _Var1 = player_can_read(player,true);
    if (_Var1) {
      wVar2 = cmd_get_item((command_conflict *)cmd,"item",&local_18,"Read which scroll? ",
                           "You have no scrolls to read.",tval_is_scroll,L'\x06');
      if (wVar2 == L'\0') {
        use_aux(cmd,local_18,USE_SINGLE,L'\0');
      }
    }
  }
  return;
}

Assistant:

void do_cmd_read_scroll(struct command *cmd)
{
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		return;
	}

	/* Check player can use scroll */
	if (!player_can_read(player, true))
		return;

	/* Get the scroll */
	if (cmd_get_item(cmd, "item", &obj,
			"Read which scroll? ",
			"You have no scrolls to read.",
			tval_is_scroll,
			USE_INVEN | USE_FLOOR) != CMD_OK) return;

	(void)use_aux(cmd, obj, USE_SINGLE, MSG_GENERIC);
}